

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCursesMainForm.cxx
# Opt level: O0

void __thiscall cmCursesMainForm::HandleInput(cmCursesMainForm *this)

{
  byte bVar1;
  _Bool _Var2;
  bool bVar3;
  __type _Var4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  undefined8 uVar9;
  FIELD *pFVar10;
  long *p2;
  ulong uVar11;
  char *pcVar12;
  long *plVar13;
  cmState *pcVar14;
  size_t sVar15;
  size_t sVar16;
  reference pvVar17;
  cmCursesLongMessageForm *pcVar18;
  long *plVar19;
  reference ppcVar20;
  int p1;
  int p1_00;
  int p1_01;
  int p1_02;
  int p1_03;
  int local_364;
  uint local_34c;
  uint local_318;
  int local_314;
  int local_300;
  uint local_2fc;
  uint local_290;
  uint local_28c;
  int local_26c;
  uint local_268;
  int local_264;
  __normal_iterator<cmCursesCacheEntryComposite_**,_std::vector<cmCursesCacheEntryComposite_*,_std::allocator<cmCursesCacheEntryComposite_*>_>_>
  local_240;
  cmCursesCacheEntryComposite **local_238;
  __normal_iterator<cmCursesCacheEntryComposite_**,_std::vector<cmCursesCacheEntryComposite_*,_std::allocator<cmCursesCacheEntryComposite_*>_>_>
  local_230;
  iterator it;
  string nextVal;
  string local_200;
  long *local_1e0;
  cmCursesWidget *lbl_1;
  FIELD *nextCur;
  size_t findex_3;
  FIELD *cur_3;
  cmCursesLongMessageForm *msgs_1;
  cmCursesLongMessageForm *msgs;
  char *message;
  string local_1a0;
  allocator local_179;
  string local_178;
  allocator local_151;
  string local_150;
  char *local_130;
  char *existingValue;
  char *helpString;
  char *curField;
  cmCursesWidget *lbl;
  FIELD *pFStack_108;
  int findex_2;
  FIELD *cur_2;
  FIELD *pFStack_f8;
  int findex_1;
  FIELD *cur_1;
  size_t findex;
  FIELD *cur;
  uint local_d8;
  bool widgetHandled;
  int key;
  undefined1 local_c8 [8];
  string searchstr;
  char debugMessage [128];
  cmCursesWidget *currentWidget;
  FIELD *currentField;
  int y;
  int x;
  cmCursesMainForm *this_local;
  
  currentField._0_4_ = 0;
  if ((this->super_cmCursesForm).Form == (FORM *)0x0) {
    return;
  }
  do {
    while( true ) {
      while( true ) {
        (*(this->super_cmCursesForm)._vptr_cmCursesForm[4])();
        iVar8 = 0;
        PrintKeys(this,0);
        if ((this->SearchMode & 1U) != 0) {
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_c8,"Search: ",&this->SearchString);
          uVar9 = std::__cxx11::string::c_str();
          (*(this->super_cmCursesForm)._vptr_cmCursesForm[6])(this,uVar9);
          PrintKeys(this,1);
          uVar5 = std::__cxx11::string::size();
          curses_move((uint)currentField - 5,uVar5);
          if (_stdscr == (long *)0x0) {
            local_264 = -1;
          }
          else {
            local_264 = *(short *)((long)_stdscr + 4) + 1;
          }
          iVar8 = 0;
          wtouchln(_stdscr,0,local_264,1);
          refresh();
          std::__cxx11::string::~string((string *)local_c8);
        }
        local_d8 = wgetch(_stdscr);
        if (_stdscr == (long *)0x0) {
          local_268 = 0xffffffff;
        }
        else {
          local_268 = (int)*(short *)((long)_stdscr + 4) + 1;
        }
        currentField._0_4_ = local_268;
        if (_stdscr == (long *)0x0) {
          local_26c = -1;
        }
        else {
          local_26c = *(short *)((long)_stdscr + 6) + 1;
        }
        if ((0x40 < local_26c) && (5 < (int)local_268)) break;
        if (local_d8 == 0x71) {
          return;
        }
      }
      pFVar10 = current_field((this->super_cmCursesForm).Form);
      p2 = (long *)field_userptr(pFVar10);
      uVar5 = local_d8;
      cur._7_1_ = 0;
      plVar19 = p2;
      if ((this->SearchMode & 1U) == 0) {
        if ((p2 != (long *)0x0) && ((this->SearchMode & 1U) == 0)) {
          plVar19 = _stdscr;
          bVar1 = (**(code **)(*p2 + 0x10))(p2,&local_d8,this);
          cur._7_1_ = bVar1 & 1;
          if (cur._7_1_ != 0) {
            this->OkToGenerate = false;
            (*(this->super_cmCursesForm)._vptr_cmCursesForm[4])();
            PrintKeys(this,0);
          }
        }
      }
      else if ((local_d8 == 10) || (local_d8 == 0x157)) {
        this->SearchMode = false;
        uVar11 = std::__cxx11::string::empty();
        if ((uVar11 & 1) == 0) {
          pcVar12 = (char *)std::__cxx11::string::c_str();
          JumpToCacheEntry(this,pcVar12);
          std::__cxx11::string::operator=
                    ((string *)&this->OldSearchString,(string *)&this->SearchString);
        }
        std::__cxx11::string::operator=((string *)&this->SearchString,"");
      }
      else if (((((int)local_d8 < 0x61) || (0x7a < (int)local_d8)) &&
               (((int)local_d8 < 0x41 || (0x5a < (int)local_d8)))) &&
              ((((int)local_d8 < 0x30 || (0x39 < (int)local_d8)) && (local_d8 != 0x5f)))) {
        uVar6 = ctrl((EVP_PKEY_CTX *)0x68,iVar8,p1,p2);
        plVar19 = (long *)(ulong)uVar6;
        if ((((uVar5 == uVar6) || (local_d8 == 0x107)) || (local_d8 == 0x14a)) &&
           (uVar11 = std::__cxx11::string::empty(), (uVar11 & 1) == 0)) {
          std::__cxx11::string::size();
          std::__cxx11::string::resize((ulong)&this->SearchString);
        }
      }
      else {
        plVar13 = (long *)std::__cxx11::string::size();
        plVar19 = (long *)(long)(local_26c + -10);
        if (plVar13 < plVar19) {
          std::__cxx11::string::operator+=((string *)&this->SearchString,(char)local_d8);
        }
      }
      if (((p2 != (long *)0x0) && ((cur._7_1_ & 1) != 0)) || ((this->SearchMode & 1U) != 0))
      goto LAB_00437c9a;
      iVar8 = 0x8ec4a3;
      sprintf(searchstr.field_2._M_local_buf + 8,"Main form handling input, key: %d",(ulong)local_d8
             );
      cmCursesForm::LogMessage(searchstr.field_2._M_local_buf + 8);
      uVar5 = local_d8;
      if (local_d8 == 0x71) {
        return;
      }
      if (local_d8 != 0x102) break;
LAB_00436dcd:
      findex = (size_t)current_field((this->super_cmCursesForm).Form);
      iVar8 = field_index((FIELD *)findex);
      cur_1 = (FIELD *)(long)iVar8;
      if (cur_1 != (FIELD *)(this->NumberOfVisibleEntries * 3 + -1)) {
        _Var2 = new_page(this->Fields[(long)((long)&cur_1->status + 1)]);
        if (_Var2) {
          form_driver((this->super_cmCursesForm).Form,0x200);
        }
        else {
          form_driver((this->super_cmCursesForm).Form,0x204);
        }
        goto LAB_00437c9a;
      }
    }
    uVar7 = ctrl((EVP_PKEY_CTX *)0x6e,iVar8,p1_00,plVar19);
    uVar6 = local_d8;
    if (uVar5 == uVar7) goto LAB_00436dcd;
    if (local_d8 != 0x103) {
      uVar7 = ctrl((EVP_PKEY_CTX *)0x70,iVar8,p1_01,(void *)(ulong)uVar7);
      uVar5 = local_d8;
      if (uVar6 != uVar7) {
        if (local_d8 != 0x152) {
          uVar7 = ctrl((EVP_PKEY_CTX *)0x64,iVar8,p1_02,(void *)(ulong)uVar7);
          uVar6 = local_d8;
          if (uVar5 != uVar7) {
            if ((local_d8 == 0x153) ||
               (uVar5 = ctrl((EVP_PKEY_CTX *)0x75,iVar8,p1_03,(void *)(ulong)uVar7), uVar6 == uVar5)
               ) {
              form_driver((this->super_cmCursesForm).Form,0x201);
            }
            else if (local_d8 == 99) {
              Configure(this,0);
            }
            else if (local_d8 == 0x68) {
              if (_stdscr == (long *)0x0) {
                local_28c = 0xffffffff;
              }
              else {
                local_28c = (int)*(short *)((long)_stdscr + 4) + 1;
              }
              currentField._0_4_ = local_28c;
              if (_stdscr == (long *)0x0) {
                local_290 = 0xffffffff;
              }
              else {
                local_290 = (int)*(short *)((long)_stdscr + 6) + 1;
              }
              pFStack_108 = current_field((this->super_cmCursesForm).Form);
              lbl._4_4_ = field_index(pFStack_108);
              curField = (char *)field_userptr(this->Fields[lbl._4_4_ + -2]);
              helpString = (char *)(**(code **)(*(long *)curField + 0x28))();
              existingValue = (char *)0x0;
              pcVar14 = cmake::GetState(this->CMakeInstance);
              pcVar12 = helpString;
              std::allocator<char>::allocator();
              std::__cxx11::string::string((string *)&local_150,pcVar12,&local_151);
              pcVar12 = cmState::GetCacheEntryValue(pcVar14,&local_150);
              std::__cxx11::string::~string((string *)&local_150);
              std::allocator<char>::~allocator((allocator<char> *)&local_151);
              local_130 = pcVar12;
              if (pcVar12 != (char *)0x0) {
                pcVar14 = cmake::GetState(this->CMakeInstance);
                pcVar12 = helpString;
                std::allocator<char>::allocator();
                std::__cxx11::string::string((string *)&local_178,pcVar12,&local_179);
                std::allocator<char>::allocator();
                std::__cxx11::string::string
                          ((string *)&local_1a0,"HELPSTRING",(allocator *)((long)&message + 7));
                existingValue = cmState::GetCacheEntryProperty(pcVar14,&local_178,&local_1a0);
                std::__cxx11::string::~string((string *)&local_1a0);
                std::allocator<char>::~allocator((allocator<char> *)((long)&message + 7));
                std::__cxx11::string::~string((string *)&local_178);
                std::allocator<char>::~allocator((allocator<char> *)&local_179);
              }
              if (existingValue == (char *)0x0) {
                pvVar17 = std::
                          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ::operator[](&this->HelpMessage,1);
                std::__cxx11::string::operator=((string *)pvVar17,"");
              }
              else {
                sVar15 = strlen(helpString);
                sVar16 = strlen(existingValue);
                msgs = (cmCursesLongMessageForm *)operator_new__(sVar15 + sVar16 + 0x40);
                sprintf((char *)msgs,"Current option is: %s\nHelp string for this option is: %s\n",
                        helpString,existingValue);
                pcVar18 = msgs;
                pvVar17 = std::
                          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ::operator[](&this->HelpMessage,1);
                std::__cxx11::string::operator=((string *)pvVar17,(char *)pcVar18);
                if (msgs != (cmCursesLongMessageForm *)0x0) {
                  operator_delete__(msgs);
                }
              }
              pcVar18 = (cmCursesLongMessageForm *)operator_new(0x60);
              cmCursesLongMessageForm::cmCursesLongMessageForm(pcVar18,&this->HelpMessage,"Help.");
              cmCursesForm::CurrentForm = (cmCursesForm *)pcVar18;
              msgs_1 = pcVar18;
              (*(pcVar18->super_cmCursesForm)._vptr_cmCursesForm[3])
                        (pcVar18,1,1,(ulong)local_290,(ulong)local_28c);
              (*(msgs_1->super_cmCursesForm)._vptr_cmCursesForm[2])();
              cmCursesForm::CurrentForm = &this->super_cmCursesForm;
              (*(this->super_cmCursesForm)._vptr_cmCursesForm[3])
                        (this,1,1,(ulong)local_290,(ulong)local_28c);
              set_current_field((this->super_cmCursesForm).Form,pFStack_108);
            }
            else if (local_d8 == 0x6c) {
              if (_stdscr == (long *)0x0) {
                local_2fc = 0xffffffff;
              }
              else {
                local_2fc = (int)*(short *)((long)_stdscr + 4) + 1;
              }
              currentField._0_4_ = local_2fc;
              if (_stdscr == (long *)0x0) {
                local_300 = -1;
              }
              else {
                local_300 = *(short *)((long)_stdscr + 6) + 1;
              }
              pFVar10 = (FIELD *)operator_new(0x60);
              cmCursesLongMessageForm::cmCursesLongMessageForm
                        ((cmCursesLongMessageForm *)pFVar10,&this->Errors,
                         "Errors occurred during the last pass.");
              cmCursesForm::CurrentForm = (cmCursesForm *)pFVar10;
              cur_3 = pFVar10;
              (**(code **)(*(long *)pFVar10 + 0x18))(pFVar10,1,1,local_300,local_2fc);
              (**(code **)(*(long *)cur_3 + 0x10))();
              cmCursesForm::CurrentForm = &this->super_cmCursesForm;
              (*(this->super_cmCursesForm)._vptr_cmCursesForm[3])();
            }
            else if (local_d8 == 0x2f) {
              this->SearchMode = true;
              (*(this->super_cmCursesForm)._vptr_cmCursesForm[6])(this,"Search");
              PrintKeys(this,1);
              if (_stdscr == (long *)0x0) {
                local_314 = -1;
              }
              else {
                local_314 = *(short *)((long)_stdscr + 4) + 1;
              }
              wtouchln(_stdscr,0,local_314,1);
              refresh();
            }
            else if (local_d8 == 0x6e) {
              uVar11 = std::__cxx11::string::empty();
              if ((uVar11 & 1) == 0) {
                pcVar12 = (char *)std::__cxx11::string::c_str();
                JumpToCacheEntry(this,pcVar12);
              }
            }
            else if (local_d8 == 0x74) {
              if ((this->AdvancedMode & 1U) == 0) {
                this->AdvancedMode = true;
              }
              else {
                this->AdvancedMode = false;
              }
              if (_stdscr == (long *)0x0) {
                local_318 = 0xffffffff;
              }
              else {
                local_318 = (int)*(short *)((long)_stdscr + 4) + 1;
              }
              currentField._0_4_ = local_318;
              RePost(this);
              (*(this->super_cmCursesForm)._vptr_cmCursesForm[3])();
            }
            else if (local_d8 == 0x67) {
              if ((this->OkToGenerate & 1U) != 0) {
                Generate(this);
                return;
              }
            }
            else if ((local_d8 == 100) && (this->NumberOfVisibleEntries != 0)) {
              this->OkToGenerate = false;
              findex_3 = (size_t)current_field((this->super_cmCursesForm).Form);
              iVar8 = field_index((FIELD *)findex_3);
              nextCur = (FIELD *)(long)iVar8;
              if (nextCur == (FIELD *)0x2) {
                lbl_1 = (cmCursesWidget *)0x0;
              }
              else if (nextCur == (FIELD *)(this->NumberOfVisibleEntries * 3 + -1)) {
                lbl_1 = (cmCursesWidget *)this->Fields[(long)((long)&nextCur[-1].usrptr + 3)];
              }
              else {
                lbl_1 = (cmCursesWidget *)this->Fields[(long)((long)&nextCur->status + 1)];
              }
              local_1e0 = (long *)field_userptr(this->Fields[(long)((long)&nextCur[-1].usrptr + 6)])
              ;
              if (local_1e0 != (long *)0x0) {
                pcVar14 = cmake::GetState(this->CMakeInstance);
                pcVar12 = (char *)(**(code **)(*local_1e0 + 0x28))();
                std::allocator<char>::allocator();
                std::__cxx11::string::string
                          ((string *)&local_200,pcVar12,
                           (allocator *)(nextVal.field_2._M_local_buf + 0xf));
                cmState::RemoveCacheEntry(pcVar14,&local_200);
                std::__cxx11::string::~string((string *)&local_200);
                std::allocator<char>::~allocator
                          ((allocator<char> *)(nextVal.field_2._M_local_buf + 0xf));
                std::__cxx11::string::string((string *)&it);
                if (lbl_1 != (cmCursesWidget *)0x0) {
                  plVar19 = (long *)field_userptr((FIELD *)lbl_1);
                  pcVar12 = (char *)(**(code **)(*plVar19 + 0x28))();
                  std::__cxx11::string::operator=((string *)&it,pcVar12);
                }
                if (_stdscr == (long *)0x0) {
                  local_34c = 0xffffffff;
                }
                else {
                  local_34c = (int)*(short *)((long)_stdscr + 4) + 1;
                }
                currentField._0_4_ = local_34c;
                pcVar12 = (char *)(**(code **)(*local_1e0 + 0x28))();
                RemoveEntry(this,pcVar12);
                RePost(this);
                (*(this->super_cmCursesForm)._vptr_cmCursesForm[3])();
                if (lbl_1 != (cmCursesWidget *)0x0) {
                  lbl_1 = (cmCursesWidget *)0x0;
                  __gnu_cxx::
                  __normal_iterator<cmCursesCacheEntryComposite_**,_std::vector<cmCursesCacheEntryComposite_*,_std::allocator<cmCursesCacheEntryComposite_*>_>_>
                  ::__normal_iterator(&local_230);
                  local_238 = (cmCursesCacheEntryComposite **)
                              std::
                              vector<cmCursesCacheEntryComposite_*,_std::allocator<cmCursesCacheEntryComposite_*>_>
                              ::begin(this->Entries);
                  local_230._M_current = local_238;
                  while( true ) {
                    local_240._M_current =
                         (cmCursesCacheEntryComposite **)
                         std::
                         vector<cmCursesCacheEntryComposite_*,_std::allocator<cmCursesCacheEntryComposite_*>_>
                         ::end(this->Entries);
                    bVar3 = __gnu_cxx::operator!=(&local_230,&local_240);
                    if (!bVar3) break;
                    ppcVar20 = __gnu_cxx::
                               __normal_iterator<cmCursesCacheEntryComposite_**,_std::vector<cmCursesCacheEntryComposite_*,_std::allocator<cmCursesCacheEntryComposite_*>_>_>
                               ::operator*(&local_230);
                    _Var4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)&it,&(*ppcVar20)->Key);
                    if (_Var4) {
                      ppcVar20 = __gnu_cxx::
                                 __normal_iterator<cmCursesCacheEntryComposite_**,_std::vector<cmCursesCacheEntryComposite_*,_std::allocator<cmCursesCacheEntryComposite_*>_>_>
                                 ::operator*(&local_230);
                      lbl_1 = (cmCursesWidget *)(*ppcVar20)->Entry->Field;
                    }
                    __gnu_cxx::
                    __normal_iterator<cmCursesCacheEntryComposite_**,_std::vector<cmCursesCacheEntryComposite_*,_std::allocator<cmCursesCacheEntryComposite_*>_>_>
                    ::operator++(&local_230);
                  }
                  if (lbl_1 != (cmCursesWidget *)0x0) {
                    set_current_field((this->super_cmCursesForm).Form,(FIELD *)lbl_1);
                  }
                }
                std::__cxx11::string::~string((string *)&it);
              }
            }
            goto LAB_00437c9a;
          }
        }
        form_driver((this->super_cmCursesForm).Form,0x200);
        goto LAB_00437c9a;
      }
    }
    pFStack_f8 = current_field((this->super_cmCursesForm).Form);
    cur_2._4_4_ = field_index(pFStack_f8);
    if (cur_2._4_4_ != 2) {
      _Var2 = new_page(this->Fields[cur_2._4_4_ + -2]);
      if (_Var2) {
        form_driver((this->super_cmCursesForm).Form,0x201);
        set_current_field((this->super_cmCursesForm).Form,this->Fields[cur_2._4_4_ + -3]);
      }
      else {
        form_driver((this->super_cmCursesForm).Form,0x205);
      }
LAB_00437c9a:
      if (_stdscr == (long *)0x0) {
        local_364 = -1;
      }
      else {
        local_364 = *(short *)((long)_stdscr + 4) + 1;
      }
      wtouchln(_stdscr,0,local_364,1);
      wrefresh(_stdscr);
    }
  } while( true );
}

Assistant:

void cmCursesMainForm::HandleInput()
{
  int x=0,y=0;

  if (!this->Form)
    {
    return;
    }

  FIELD* currentField;
  cmCursesWidget* currentWidget;

  char debugMessage[128];

  for(;;)
    {
    this->UpdateStatusBar();
    this->PrintKeys();
    if ( this->SearchMode )
      {
      std::string searchstr = "Search: " + this->SearchString;
      this->UpdateStatusBar( searchstr.c_str() );
      this->PrintKeys(1);
      curses_move(y-5,static_cast<unsigned int>(searchstr.size()));
      //curses_move(1,1);
      touchwin(stdscr);
      refresh();
      }
    int key = getch();

    getmaxyx(stdscr, y, x);
    // If window too small, handle 'q' only
    if ( x < cmCursesMainForm::MIN_WIDTH  ||
         y < cmCursesMainForm::MIN_HEIGHT )
      {
      // quit
      if ( key == 'q' )
        {
        break;
        }
      else
        {
        continue;
        }
      }

    currentField = current_field(this->Form);
    currentWidget = reinterpret_cast<cmCursesWidget*>(field_userptr(
      currentField));

    bool widgetHandled=false;

    if ( this->SearchMode )
      {
      if ( key == 10 || key == KEY_ENTER )
        {
        this->SearchMode = false;
        if (!this->SearchString.empty())
          {
          this->JumpToCacheEntry(this->SearchString.c_str());
          this->OldSearchString = this->SearchString;
          }
        this->SearchString = "";
        }
      /*
      else if ( key == KEY_ESCAPE )
        {
        this->SearchMode = false;
        }
      */
      else if ((key >= 'a' && key <= 'z') ||
               (key >= 'A' && key <= 'Z') ||
               (key >= '0' && key <= '9') ||
               (key == '_' ))
        {
        if ( this->SearchString.size() < static_cast<std::string::size_type>(x-10) )
          {
          this->SearchString += static_cast<char>(key);
          }
        }
      else if ( key == ctrl('h') || key == KEY_BACKSPACE || key == KEY_DC )
        {
        if (!this->SearchString.empty())
          {
          this->SearchString.resize(this->SearchString.size()-1);
          }
        }
      }
    else if (currentWidget && !this->SearchMode)
      {
      // Ask the current widget if it wants to handle input
      widgetHandled = currentWidget->HandleInput(key, this, stdscr);
      if (widgetHandled)
        {
        this->OkToGenerate = false;
        this->UpdateStatusBar();
        this->PrintKeys();
        }
      }
    if ((!currentWidget || !widgetHandled) && !this->SearchMode)
      {
      // If the current widget does not want to handle input,
      // we handle it.
      sprintf(debugMessage, "Main form handling input, key: %d", key);
      cmCursesForm::LogMessage(debugMessage);
      // quit
      if ( key == 'q' )
        {
        break;
        }
      // if not end of page, next field otherwise next page
      // each entry consists of fields: label, isnew, value
      // therefore, the label field for the prev. entry is index-5
      // and the label field for the next entry is index+1
      // (index always corresponds to the value field)
      else if ( key == KEY_DOWN || key == ctrl('n') )
        {
        FIELD* cur = current_field(this->Form);
        size_t findex = field_index(cur);
        if ( findex == 3*this->NumberOfVisibleEntries-1 )
          {
          continue;
          }
        if (new_page(this->Fields[findex+1]))
          {
          form_driver(this->Form, REQ_NEXT_PAGE);
          }
        else
          {
          form_driver(this->Form, REQ_NEXT_FIELD);
          }
        }
      // if not beginning of page, previous field, otherwise previous page
      // each entry consists of fields: label, isnew, value
      // therefore, the label field for the prev. entry is index-5
      // and the label field for the next entry is index+1
      // (index always corresponds to the value field)
      else if ( key == KEY_UP || key == ctrl('p') )
        {
        FIELD* cur = current_field(this->Form);
        int findex = field_index(cur);
        if ( findex == 2 )
          {
          continue;
          }
        if ( new_page(this->Fields[findex-2]) )
          {
          form_driver(this->Form, REQ_PREV_PAGE);
          set_current_field(this->Form, this->Fields[findex-3]);
          }
        else
          {
          form_driver(this->Form, REQ_PREV_FIELD);
          }
        }
      // pg down
      else if ( key == KEY_NPAGE || key == ctrl('d') )
        {
        form_driver(this->Form, REQ_NEXT_PAGE);
        }
      // pg up
      else if ( key == KEY_PPAGE || key == ctrl('u') )
        {
        form_driver(this->Form, REQ_PREV_PAGE);
        }
      // configure
      else if ( key == 'c' )
        {
        this->Configure();
        }
      // display help
      else if ( key == 'h' )
        {
        getmaxyx(stdscr, y, x);

        FIELD* cur = current_field(this->Form);
        int findex = field_index(cur);
        cmCursesWidget* lbl = reinterpret_cast<cmCursesWidget*>(field_userptr(
          this->Fields[findex-2]));
        const char* curField = lbl->GetValue();
        const char* helpString = 0;

        const char* existingValue =
            this->CMakeInstance->GetState()
                ->GetCacheEntryValue(curField);
        if (existingValue)
          {
          helpString = this->CMakeInstance->GetState()
                           ->GetCacheEntryProperty(curField, "HELPSTRING");
          }
        if (helpString)
          {
          char* message = new char[strlen(curField)+strlen(helpString)
                                  +strlen("Current option is: \n Help string for this option is: \n")+10];
          sprintf(message,"Current option is: %s\nHelp string for this option is: %s\n", curField, helpString);
          this->HelpMessage[1] = message;
          delete[] message;
          }
        else
          {
          this->HelpMessage[1] = "";
          }

        cmCursesLongMessageForm* msgs = new cmCursesLongMessageForm(this->HelpMessage,
                                                                    "Help.");
        CurrentForm = msgs;
        msgs->Render(1,1,x,y);
        msgs->HandleInput();
        CurrentForm = this;
        this->Render(1,1,x,y);
        set_current_field(this->Form, cur);
        }
      // display last errors
      else if ( key == 'l' )
        {
        getmaxyx(stdscr, y, x);
        cmCursesLongMessageForm* msgs = new cmCursesLongMessageForm(this->Errors,
                                                                    "Errors occurred during the last pass.");
        CurrentForm = msgs;
        msgs->Render(1,1,x,y);
        msgs->HandleInput();
        CurrentForm = this;
        this->Render(1,1,x,y);
        }
      else if ( key == '/' )
        {
        this->SearchMode = true;
        this->UpdateStatusBar("Search");
        this->PrintKeys(1);
        touchwin(stdscr);
        refresh();
        }
      else if ( key == 'n' )
        {
        if (!this->OldSearchString.empty())
          {
          this->JumpToCacheEntry(this->OldSearchString.c_str());
          }
        }
      // switch advanced on/off
      else if ( key == 't' )
        {
        if (this->AdvancedMode)
          {
          this->AdvancedMode = false;
          }
        else
          {
          this->AdvancedMode = true;
          }
        getmaxyx(stdscr, y, x);
        this->RePost();
        this->Render(1, 1, x, y);
        }
      // generate and exit
      else if ( key == 'g' )
        {
        if ( this->OkToGenerate )
          {
          this->Generate();
          break;
          }
        }
      // delete cache entry
      else if ( key == 'd' && this->NumberOfVisibleEntries )
        {
        this->OkToGenerate = false;
        FIELD* cur = current_field(this->Form);
        size_t findex = field_index(cur);

        // make the next or prev. current field after deletion
        // each entry consists of fields: label, isnew, value
        // therefore, the label field for the prev. entry is findex-5
        // and the label field for the next entry is findex+1
        // (findex always corresponds to the value field)
        FIELD* nextCur;
        if ( findex == 2 )
          {
          nextCur=0;
          }
        else if ( findex == 3*this->NumberOfVisibleEntries-1 )
          {
          nextCur = this->Fields[findex-5];
          }
        else
          {
          nextCur = this->Fields[findex+1];
          }

        // Get the label widget
        // each entry consists of fields: label, isnew, value
        // therefore, the label field for the is findex-2
        // (findex always corresponds to the value field)
        cmCursesWidget* lbl
          = reinterpret_cast<cmCursesWidget*>(
            field_userptr(this->Fields[findex-2]));
        if ( lbl )
          {
          this->CMakeInstance->GetState()->RemoveCacheEntry(lbl->GetValue());

          std::string nextVal;
          if (nextCur)
            {
            nextVal = (reinterpret_cast<cmCursesWidget*>(field_userptr(nextCur))->GetValue());
            }

          getmaxyx(stdscr, y, x);
          this->RemoveEntry(lbl->GetValue());
          this->RePost();
          this->Render(1, 1, x, y);

          if (nextCur)
            {
            // make the next or prev. current field after deletion
            nextCur = 0;
            std::vector<cmCursesCacheEntryComposite*>::iterator it;
            for (it = this->Entries->begin(); it != this->Entries->end(); ++it)
              {
              if (nextVal == (*it)->Key)
                {
                nextCur = (*it)->Entry->Field;
                }
              }

            if (nextCur)
              {
              set_current_field(this->Form, nextCur);
              }
            }
          }
        }
      }

    touchwin(stdscr);
    wrefresh(stdscr);
    }
}